

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest_test.cxx
# Opt level: O2

void __thiscall c_array_digest_test::test_method(c_array_digest_test *this)

{
  uchar (*in_RDX) [4];
  array<unsigned_char,_20UL> *container;
  uint8_t c_array [4];
  string str;
  char *local_78;
  char *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  char *local_58;
  char *local_50;
  digest_type hash;
  undefined **local_30;
  undefined1 local_28;
  undefined8 *local_20;
  char *local_18;
  
  c_array[0] = '\0';
  c_array[1] = '\x10';
  c_array[2] = ' ';
  c_array[3] = '0';
  cryptox::digest<cryptox::message_digest_algorithm<&EVP_sha1,160ul>,unsigned_char,4ul>
            ((type *)&hash,(cryptox *)c_array,in_RDX);
  cryptox::to_hex<std::array<unsigned_char,20ul>>(&str,(cryptox *)&hash,container);
  local_58 = 
  "/workspace/llm4binary/github/license_c_cmakelists/madera[P]cryptox/tests/core/cryptox/message_digests/digest_test.cxx"
  ;
  local_50 = "";
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  local_60 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_58,0x24);
  local_28 = 0;
  local_30 = &PTR__lazy_ostream_002b7238;
  local_20 = &boost::unit_test::lazy_ostream::inst;
  local_18 = "";
  local_78 = 
  "/workspace/llm4binary/github/license_c_cmakelists/madera[P]cryptox/tests/core/cryptox/message_digests/digest_test.cxx"
  ;
  local_70 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[41]>
            (&local_30,&local_78,0x24,1,2,&str,"str","e89fc658068627378403ebfdcefcb13250579b50",
             "\"e89fc658068627378403ebfdcefcb13250579b50\"");
  std::__cxx11::string::~string((string *)&str);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(c_array_digest_test) {
	const std::uint8_t c_array[] = { 0x00, 0x10, 0x20, 0x30 };
	const sha1::digest_type hash = digest<sha1>(c_array);
	const std::string str = to_hex(hash);
	BOOST_CHECK_EQUAL(str, "e89fc658068627378403ebfdcefcb13250579b50");
}